

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O3

void __thiscall ChronoTest_FormatSpecs_Test::TestBody(ChronoTest_FormatSpecs_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_19;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_21;
  AssertionResult gtest_ar;
  internal local_290 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined8 local_260;
  undefined8 *local_258;
  code *local_250;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{:%%}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
                ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args,(locale_ref)0x0);
  paVar1 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            (local_290,"\"%\"","fmt::format(\"{:%%}\", std::chrono::seconds(0))",(char (*) [2])"%",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{:%n}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_00,args_00,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            (local_290,"\"\\n\"","fmt::format(\"{:%n}\", std::chrono::seconds(0))",
             (char (*) [2])0x164834,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_01.size_ = 5;
  format_str_01.data_ = "{:%t}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_01,args_01,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            (local_290,"\"\\t\"","fmt::format(\"{:%t}\", std::chrono::seconds(0))",
             (char (*) [2])"\t",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_02.size_ = 5;
  format_str_02.data_ = "{:%S}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_02,args_02,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%S}\", std::chrono::seconds(0))",(char (*) [3])"00"
             ,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3c;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_03.size_ = 5;
  format_str_03.data_ = "{:%S}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_03,args_03,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%S}\", std::chrono::seconds(60))",
             (char (*) [3])"00",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x2a;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_04.size_ = 5;
  format_str_04.data_ = "{:%S}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_04,args_04,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"42\"","fmt::format(\"{:%S}\", std::chrono::seconds(42))",
             (char (*) [3])"42",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x4d2;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1000l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_05.size_ = 5;
  format_str_05.data_ = "{:%S}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1000l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_05,args_05,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_290,"\"01.234\"","fmt::format(\"{:%S}\", std::chrono::milliseconds(1234))",
             (char (*) [7])"01.234",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<60l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_06.size_ = 5;
  format_str_06.data_ = "{:%M}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<60l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_06,args_06,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%M}\", std::chrono::minutes(0))",(char (*) [3])"00"
             ,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3c;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<60l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_07.size_ = 5;
  format_str_07.data_ = "{:%M}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<60l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_07,args_07,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%M}\", std::chrono::minutes(60))",
             (char (*) [3])"00",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x2a;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<60l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_08.size_ = 5;
  format_str_08.data_ = "{:%M}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<60l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_08,args_08,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"42\"","fmt::format(\"{:%M}\", std::chrono::minutes(42))",
             (char (*) [3])"42",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3d;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_09.size_ = 5;
  format_str_09.data_ = "{:%M}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_09,args_09,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"01\"","fmt::format(\"{:%M}\", std::chrono::seconds(61))",
             (char (*) [3])"01",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_10.size_ = 5;
  format_str_10.data_ = "{:%H}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_10,args_10,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%H}\", std::chrono::hours(0))",(char (*) [3])"00",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x18;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_11.size_ = 5;
  format_str_11.data_ = "{:%H}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_11,args_11,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"00\"","fmt::format(\"{:%H}\", std::chrono::hours(24))",(char (*) [3])"00",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0xe;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_12.size_ = 5;
  format_str_12.data_ = "{:%H}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_12,args_12,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"14\"","fmt::format(\"{:%H}\", std::chrono::hours(14))",(char (*) [3])"14",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3d;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<60l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_13.size_ = 5;
  format_str_13.data_ = "{:%H}";
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<60l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_13,args_13,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"01\"","fmt::format(\"{:%H}\", std::chrono::minutes(61))",
             (char (*) [3])"01",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_14.size_ = 5;
  format_str_14.data_ = "{:%I}";
  args_14.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_14.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_14,args_14,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"12\"","fmt::format(\"{:%I}\", std::chrono::hours(0))",(char (*) [3])"12",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0xc;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_15.size_ = 5;
  format_str_15.data_ = "{:%I}";
  args_15.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_15.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_15,args_15,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"12\"","fmt::format(\"{:%I}\", std::chrono::hours(12))",(char (*) [3])"12",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x18;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_16.size_ = 5;
  format_str_16.data_ = "{:%I}";
  args_16.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_16.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_16,args_16,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"12\"","fmt::format(\"{:%I}\", std::chrono::hours(24))",(char (*) [3])"12",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 4;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_17.size_ = 5;
  format_str_17.data_ = "{:%I}";
  args_17.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_17.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_17,args_17,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"04\"","fmt::format(\"{:%I}\", std::chrono::hours(4))",(char (*) [3])"04",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0xe;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<3600l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_18.size_ = 5;
  format_str_18.data_ = "{:%I}";
  args_18.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_18.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<3600l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_18,args_18,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_290,"\"02\"","fmt::format(\"{:%I}\", std::chrono::hours(14))",(char (*) [3])"02",
             &local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3039;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_19.size_ = 0xb;
  format_str_19.data_ = "{:%H:%M:%S}";
  args_19.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_19.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_19,args_19,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_290,"\"03:25:45\"","fmt::format(\"{:%H:%M:%S}\", std::chrono::seconds(12345))",
             (char (*) [9])0x160a81,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3039;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_20.size_ = 5;
  format_str_20.data_ = "{:%R}";
  args_20.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_20.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_20,args_20,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_290,"\"03:25\"","fmt::format(\"{:%R}\", std::chrono::seconds(12345))",
             (char (*) [6])"03:25",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_260 = 0x3039;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_238 = 0;
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  local_230 = 500;
  format_str_21.size_ = 5;
  format_str_21.data_ = "{:%T}";
  args_21.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_258;
  args_21.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_258 = &local_260;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str_21,args_21,(locale_ref)0x0);
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,local_240,local_240 + local_238);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00181020
  ;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_290,"\"03:25:45\"","fmt::format(\"{:%T}\", std::chrono::seconds(12345))",
             (char (*) [9])0x160a81,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_288.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_288.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_248.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ChronoTest, FormatSpecs) {
  EXPECT_EQ("%", fmt::format("{:%%}", std::chrono::seconds(0)));
  EXPECT_EQ("\n", fmt::format("{:%n}", std::chrono::seconds(0)));
  EXPECT_EQ("\t", fmt::format("{:%t}", std::chrono::seconds(0)));
  EXPECT_EQ("00", fmt::format("{:%S}", std::chrono::seconds(0)));
  EXPECT_EQ("00", fmt::format("{:%S}", std::chrono::seconds(60)));
  EXPECT_EQ("42", fmt::format("{:%S}", std::chrono::seconds(42)));
  EXPECT_EQ("01.234", fmt::format("{:%S}", std::chrono::milliseconds(1234)));
  EXPECT_EQ("00", fmt::format("{:%M}", std::chrono::minutes(0)));
  EXPECT_EQ("00", fmt::format("{:%M}", std::chrono::minutes(60)));
  EXPECT_EQ("42", fmt::format("{:%M}", std::chrono::minutes(42)));
  EXPECT_EQ("01", fmt::format("{:%M}", std::chrono::seconds(61)));
  EXPECT_EQ("00", fmt::format("{:%H}", std::chrono::hours(0)));
  EXPECT_EQ("00", fmt::format("{:%H}", std::chrono::hours(24)));
  EXPECT_EQ("14", fmt::format("{:%H}", std::chrono::hours(14)));
  EXPECT_EQ("01", fmt::format("{:%H}", std::chrono::minutes(61)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(0)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(12)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(24)));
  EXPECT_EQ("04", fmt::format("{:%I}", std::chrono::hours(4)));
  EXPECT_EQ("02", fmt::format("{:%I}", std::chrono::hours(14)));
  EXPECT_EQ("03:25:45",
            fmt::format("{:%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("03:25", fmt::format("{:%R}", std::chrono::seconds(12345)));
  EXPECT_EQ("03:25:45", fmt::format("{:%T}", std::chrono::seconds(12345)));
}